

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_edge_swap
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_DBL *pRVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_INT RVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  REF_INT RVar13;
  char *pcVar14;
  REF_CELL pRVar15;
  long lVar16;
  REF_INT local_90;
  REF_BOOL all_local;
  REF_INT node2;
  REF_CELL local_80;
  REF_INT node3;
  ulong local_70;
  ulong local_68;
  REF_NODE local_60;
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  REF_INT local_44;
  REF_INT local_40;
  int local_3c;
  long local_38;
  
  local_60 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  pRVar2 = local_60->part;
  iVar10 = local_60->ref_mpi->id;
  local_38 = (long)node0;
  if (((iVar10 == pRVar2[local_38]) && (iVar10 == pRVar2[node1])) && (iVar10 == pRVar2[node])) {
    if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
      return 0;
    }
    pRVar15 = ref_grid->cell[8];
    local_70 = 0xffffffff;
    RVar13 = -1;
    if (-1 < node0) {
      pRVar3 = pRVar15->ref_adj;
      local_70 = 0xffffffff;
      RVar13 = -1;
      if (node0 < pRVar3->nnode) {
        uVar7 = pRVar3->first[local_38];
        local_70 = 0xffffffff;
        RVar13 = -1;
        if ((long)(int)uVar7 != -1) {
          RVar13 = pRVar3->item[(int)uVar7].ref;
          local_70 = (ulong)uVar7;
        }
      }
    }
    while ((int)local_70 != -1) {
      local_80 = (REF_CELL)(long)RVar13;
      local_68 = CONCAT44(local_68._4_4_,RVar13);
      for (iVar10 = 0; iVar10 < pRVar15->node_per; iVar10 = iVar10 + 1) {
        if (pRVar15->c2n[pRVar15->size_per * RVar13 + iVar10] == node1) {
          RVar13 = (REF_INT)local_68;
          uVar7 = ref_list_contains(ref_cavity->tet_list,(REF_INT)local_68,&already_have_it);
          if (uVar7 != 0) {
            pcVar14 = "have tet?";
            uVar11 = 0x522;
            goto LAB_001b7828;
          }
          if (already_have_it != 0) {
            pcVar14 = "added tet twice?";
            uVar11 = 0x523;
            goto LAB_001b787e;
          }
          uVar7 = ref_list_push(ref_cavity->tet_list,RVar13);
          if (uVar7 != 0) {
            pcVar14 = "save tet";
            uVar11 = 0x524;
            goto LAB_001b7828;
          }
          uVar7 = ref_cell_all_local(pRVar15,local_60,RVar13,&all_local);
          if (uVar7 != 0) {
            pcVar14 = "local cell";
            uVar11 = 0x525;
            goto LAB_001b7828;
          }
          if (all_local == 0) goto LAB_001b7a99;
          for (lVar16 = 0; lVar16 < pRVar15->face_per; lVar16 = lVar16 + 1) {
            pRVar2 = pRVar15->c2n;
            iVar1 = pRVar15->size_per;
            pRVar4 = pRVar15->f2n;
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              face_nodes[lVar12] =
                   pRVar2[(long)pRVar4[(ulong)((uint)lVar16 & 0x3fffffff) * 4 + lVar12] +
                          (long)iVar1 * (long)local_80];
            }
            if (((face_nodes[1] != node0 && face_nodes[0] != node0) && face_nodes[2] != node0 ||
                 (face_nodes[1] != node1 && face_nodes[0] != node1) && face_nodes[2] != node1) &&
               (uVar7 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar7 != 0)) {
              pcVar14 = "tet side";
              uVar11 = 0x534;
              goto LAB_001b7828;
            }
          }
        }
        RVar13 = (REF_INT)local_68;
      }
      pRVar5 = pRVar15->ref_adj->item;
      local_70 = (ulong)pRVar5[(int)local_70].next;
      RVar13 = -1;
      if (local_70 != 0xffffffffffffffff) {
        RVar13 = pRVar5[local_70].ref;
      }
    }
    pRVar15 = ref_grid->cell[3];
    uVar7 = ref_cell_has_side(pRVar15,node0,node1,&has_triangle);
    if (uVar7 != 0) {
      pcVar14 = "triangle side";
      uVar11 = 0x53b;
      goto LAB_001b7828;
    }
    if (has_triangle != 0) {
      uVar7 = ref_swap_node23(ref_grid,node0,node1,&node2,&node3);
      if (uVar7 != 0) {
        pcVar14 = "nodes 2 and 3";
        uVar11 = 0x53e;
        goto LAB_001b7828;
      }
      ref_cavity->surf_node = node2;
      local_90 = -1;
      local_68 = 0xffffffff;
      if (-1 < node0) {
        pRVar3 = pRVar15->ref_adj;
        local_68 = 0xffffffff;
        local_90 = -1;
        if (node0 < pRVar3->nnode) {
          uVar7 = pRVar3->first[local_38];
          local_68 = 0xffffffff;
          local_90 = -1;
          if ((long)(int)uVar7 != -1) {
            local_90 = pRVar3->item[(int)uVar7].ref;
            local_68 = (ulong)uVar7;
          }
        }
      }
      RVar13 = -1;
      local_80 = pRVar15;
      while ((int)local_68 != -1) {
        RVar9 = local_80->node_per;
        pRVar15 = local_80;
        for (lVar16 = 0; (int)lVar16 < RVar9; lVar16 = lVar16 + 1) {
          if (pRVar15->c2n[(long)pRVar15->size_per * (long)local_90 + lVar16] == node1) {
            uVar7 = ref_list_push(ref_cavity->tri_list,local_90);
            if (uVar7 != 0) {
              pcVar14 = "save tri";
              uVar11 = 0x544;
              goto LAB_001b7828;
            }
            uVar7 = ref_cell_all_local(local_80,local_60,local_90,&all_local);
            if (uVar7 != 0) {
              pcVar14 = "local cell";
              uVar11 = 0x546;
              goto LAB_001b7828;
            }
            if (all_local == 0) goto LAB_001b7a99;
            RVar9 = local_80->node_per;
            RVar13 = local_80->c2n[local_80->size_per * local_90 + RVar9];
            pRVar15 = local_80;
          }
        }
        pRVar5 = pRVar15->ref_adj->item;
        local_68 = (ulong)pRVar5[(REF_INT)local_68].next;
        local_90 = -1;
        if (local_68 != 0xffffffffffffffff) {
          local_90 = pRVar5[local_68].ref;
        }
      }
      lVar16 = (long)ref_cavity->tri_list->n;
      local_3c = RVar13;
      if (lVar16 != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x54d,"ref_cavity_form_edge_swap","expect two tri",2,lVar16);
        return 1;
      }
      if (RVar13 == -1) {
        pcVar14 = "faceid not set";
        uVar11 = 0x54e;
        local_3c = -1;
LAB_001b787e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar11,"ref_cavity_form_edge_swap",pcVar14);
        return 1;
      }
      local_40 = node3;
      local_44 = node0;
      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_44);
      if (uVar7 != 0) {
        pcVar14 = "tri side";
        uVar11 = 0x551;
        goto LAB_001b7828;
      }
      local_44 = node3;
      local_40 = node1;
      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_44);
      if (uVar7 != 0) {
        pcVar14 = "tri side";
        uVar11 = 0x554;
        goto LAB_001b7828;
      }
      local_40 = node2;
      local_44 = node1;
      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_44);
      if (uVar7 != 0) {
        pcVar14 = "tri side";
        uVar11 = 0x557;
        goto LAB_001b7828;
      }
      local_44 = node2;
      local_40 = node0;
      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_44);
      if (uVar7 != 0) {
        pcVar14 = "tri side";
        uVar11 = 0x55a;
        goto LAB_001b7828;
      }
    }
    RVar8 = ref_cavity_verify_face_manifold(ref_cavity);
    if (RVar8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x562,"ref_cavity_form_edge_swap",1,"swap face manifold");
      pRVar6 = local_60->real;
      lVar16 = (long)ref_cavity->node;
      printf(" %f %f %f\n",pRVar6[lVar16 * 0xf],pRVar6[lVar16 * 0xf + 1],pRVar6[lVar16 * 0xf + 2]);
      return 1;
    }
    RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar8 != 0) {
      pcVar14 = "swap seg manifold";
      uVar7 = 1;
      uVar11 = 0x563;
LAB_001b7828:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar11,"ref_cavity_form_edge_swap",(ulong)uVar7,pcVar14);
      return uVar7;
    }
  }
  else {
LAB_001b7a99:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_swap(REF_CAVITY ref_cavity,
                                             REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT node2, node3, face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");

  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3),
        "nodes 2 and 3");

    ref_cavity_surf_node(ref_cavity) = node2;

    seg_nodes[2] = REF_EMPTY;
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    REIS(2, ref_list_n(ref_cavity_tri_list(ref_cavity)), "expect two tri");
    RUS(REF_EMPTY, seg_nodes[2], "faceid not set");
    seg_nodes[0] = node0;
    seg_nodes[1] = node3;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node3;
    seg_nodes[1] = node1;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node1;
    seg_nodes[1] = node2;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node2;
    seg_nodes[1] = node0;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "swap face manifold", {
    printf(" %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "swap seg manifold");

  return REF_SUCCESS;
}